

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::flatten(Ref<embree::SceneGraph::Node> *node,InstancingMode mode)

{
  long *in_RSI;
  Node *in_RDI;
  InstancingMode in_stack_000001c4;
  Ref<embree::SceneGraph::Node> *in_stack_000001c8;
  SceneGraphFlattener *in_stack_000001d0;
  SceneGraphFlattener *in_stack_ffffffffffffff18;
  long *local_b8;
  _func_int **local_b0 [17];
  long **local_28;
  long **local_20;
  undefined8 *local_10;
  
  local_28 = &local_b8;
  local_b8 = (long *)*in_RSI;
  if (local_b8 != (long *)0x0) {
    (**(code **)(*local_b8 + 0x10))();
  }
  SceneGraphFlattener::SceneGraphFlattener(in_stack_000001d0,in_stack_000001c8,in_stack_000001c4);
  local_10 = local_b0;
  (in_RDI->super_RefCount)._vptr_RefCount = local_b0[0];
  local_b0[0] = (_func_int **)0x0;
  SceneGraphFlattener::~SceneGraphFlattener(in_stack_ffffffffffffff18);
  local_20 = &local_b8;
  if (local_b8 != (long *)0x0) {
    (**(code **)(*local_b8 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::flatten(Ref<Node> node, InstancingMode mode) {
    return SceneGraphFlattener(node,mode).node;
  }